

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9Tokenize(char *zInput,sxu32 nLen,SySet *pOut)

{
  ProcSort in_R8;
  ProcCmp in_R9;
  SyLex sLexer;
  SyLex local_40;
  
  local_40.pTokenSet = (SySet *)0x0;
  if ((pOut == (SySet *)0x0) || (local_40.pTokenSet = pOut, pOut->eSize == 0x20)) {
    local_40.xTokenizer = jx9TokenizeInput;
    local_40.pUserData = (void *)0x0;
    local_40.sStream.nLine = 1;
    local_40.sStream.nIgn = 0;
    local_40.sStream.zText = (uchar *)0x0;
    local_40.sStream.zEnd = (uchar *)0x0;
    local_40.sStream.pSet = pOut;
    nLen = SyLexTokenizeInput(&local_40,zInput,nLen,jx9TokenizeInput,in_R8,in_R9);
  }
  return nLen;
}

Assistant:

JX9_PRIVATE sxi32 jx9Tokenize(const char *zInput,sxu32 nLen,SySet *pOut)
{
	SyLex sLexer;
	sxi32 rc;
	/* Initialize the lexer */
	rc = SyLexInit(&sLexer, &(*pOut),jx9TokenizeInput,0);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Tokenize input */
	rc = SyLexTokenizeInput(&sLexer, zInput, nLen, 0, 0, 0);
	/* Release the lexer */
	SyLexRelease(&sLexer);
	/* Tokenization result */
	return rc;
}